

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.cpp
# Opt level: O0

void __thiscall SpeechBubble::drawSelf(SpeechBubble *this,PixelGameEngine *pge)

{
  PixelGameEngine *pPVar1;
  element_type *peVar2;
  Decal *pDVar3;
  vi2d *rhs;
  shared_ptr<olc::Renderable> *this_00;
  v2d_generic<float> local_204;
  anon_union_4_2_12391da5_for_Pixel_0 local_1fc;
  string local_1f8;
  v2d_generic<int> local_1d8;
  v2d_generic<int> local_1d0;
  vf2d local_1c8;
  v2d_generic<float> local_1c0;
  v2d_generic<float> local_1b8;
  v2d_generic<float> local_1b0;
  v2d_generic<int> local_1a8;
  v2d_generic<int> local_1a0;
  vf2d local_198;
  v2d_generic<float> local_190;
  v2d_generic<float> local_188;
  v2d_generic<float> local_180;
  v2d_generic<int> local_178;
  v2d_generic<int> local_170;
  vf2d local_168;
  v2d_generic<float> local_160;
  v2d_generic<float> local_158;
  v2d_generic<float> local_150;
  v2d_generic<int> local_148;
  v2d_generic<int> local_140;
  vf2d local_138;
  v2d_generic<float> local_130;
  v2d_generic<float> local_128;
  v2d_generic<float> local_120;
  v2d_generic<int> local_118;
  v2d_generic<int> local_110;
  vf2d local_108;
  v2d_generic<float> local_100;
  v2d_generic<float> local_f8;
  v2d_generic<float> local_f0;
  v2d_generic<int> local_e8;
  v2d_generic<int> local_e0;
  vf2d local_d8;
  v2d_generic<float> local_d0;
  v2d_generic<float> local_c8;
  v2d_generic<float> local_c0;
  v2d_generic<int> local_b8;
  v2d_generic<int> local_b0;
  v2d_generic<int> local_a8;
  vf2d local_a0;
  v2d_generic<float> local_98;
  v2d_generic<float> local_90;
  v2d_generic<float> local_88;
  v2d_generic<int> local_80;
  v2d_generic<int> local_78;
  vf2d local_70;
  v2d_generic<float> local_68;
  v2d_generic<float> local_60;
  v2d_generic<float> local_58;
  v2d_generic<int> local_50;
  v2d_generic<int> local_48;
  vf2d local_40;
  v2d_generic<float> local_38;
  v2d_generic<float> local_30;
  v2d_generic<float> local_28;
  vf2d local_20;
  PixelGameEngine *local_18;
  PixelGameEngine *pge_local;
  SpeechBubble *this_local;
  
  rhs = &this->position;
  local_18 = pge;
  pge_local = (PixelGameEngine *)this;
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_20);
  this_00 = &this->sprite;
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_28,0.0,0.0);
  olc::v2d_generic<float>::v2d_generic(&local_30,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_38,1.0,1.0);
  olc::PixelGameEngine::DrawPartialDecal
            (pge,&local_20,pDVar3,&local_28,&local_30,&local_38,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_50,(this->scale).x + -0x10,0);
  olc::v2d_generic<int>::operator+(&local_48,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_40);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_58,32.0,0.0);
  olc::v2d_generic<float>::v2d_generic(&local_60,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_68,1.0,1.0);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_40,pDVar3,&local_58,&local_60,&local_68,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_80,0,(this->scale).y + -0x10);
  olc::v2d_generic<int>::operator+(&local_78,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_70);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_88,0.0,32.0);
  olc::v2d_generic<float>::v2d_generic(&local_90,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_98,1.0,1.0);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_70,pDVar3,&local_88,&local_90,&local_98,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::operator+(&local_b0,rhs);
  olc::v2d_generic<int>::v2d_generic(&local_b8,0x10,0x10);
  olc::v2d_generic<int>::operator-(&local_a8,&local_b0);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_a0);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_c0,32.0,32.0);
  olc::v2d_generic<float>::v2d_generic(&local_c8,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_d0,1.0,1.0);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_a0,pDVar3,&local_c0,&local_c8,&local_d0,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_e8,0x10,0);
  olc::v2d_generic<int>::operator+(&local_e0,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_d8);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_f0,16.0,0.0);
  olc::v2d_generic<float>::v2d_generic(&local_f8,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_100,(float)((this->scale).x + -0x20) * 0.0625,1.0);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_d8,pDVar3,&local_f0,&local_f8,&local_100,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_118,0x10,(this->scale).y + -0x10);
  olc::v2d_generic<int>::operator+(&local_110,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_108);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_120,16.0,32.0);
  olc::v2d_generic<float>::v2d_generic(&local_128,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_130,(float)((this->scale).x + -0x20) * 0.0625,1.0);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_108,pDVar3,&local_120,&local_128,&local_130,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_148,0,0x10);
  olc::v2d_generic<int>::operator+(&local_140,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_138);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_150,0.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_158,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_160,1.0,(float)((this->scale).y + -0x20) * 0.0625);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_138,pDVar3,&local_150,&local_158,&local_160,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_178,(this->scale).x + -0x10,0x10);
  olc::v2d_generic<int>::operator+(&local_170,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_168);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_180,32.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_188,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_190,1.0,(float)((this->scale).y + -0x20) * 0.0625);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_168,pDVar3,&local_180,&local_188,&local_190,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_1a8,0x10,0x10);
  olc::v2d_generic<int>::operator+(&local_1a0,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_198);
  peVar2 = std::__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<olc::Renderable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pDVar3 = olc::Renderable::Decal(peVar2);
  olc::v2d_generic<float>::v2d_generic(&local_1b0,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic(&local_1b8,16.0,16.0);
  olc::v2d_generic<float>::v2d_generic
            (&local_1c0,(float)((this->scale).x + -0x20) * 0.0625,
             (float)((this->scale).y + -0x20) * 0.0625);
  olc::PixelGameEngine::DrawPartialDecal
            (pPVar1,&local_198,pDVar3,&local_1b0,&local_1b8,&local_1c0,(Pixel *)&olc::WHITE);
  pPVar1 = local_18;
  olc::v2d_generic<int>::v2d_generic(&local_1d8,6,6);
  olc::v2d_generic<int>::operator+(&local_1d0,rhs);
  olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_1c8);
  std::__cxx11::string::size();
  SoLoud::Wav::getLength(&this->soundSample);
  std::__cxx11::string::substr((ulong)&local_1f8,(ulong)this);
  local_1fc = olc::WHITE;
  olc::v2d_generic<float>::v2d_generic(&local_204,1.0,1.0);
  olc::PixelGameEngine::DrawStringDecal
            (pPVar1,&local_1c8,&local_1f8,(Pixel)local_1fc.field_1,&local_204);
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

void SpeechBubble::drawSelf(olc::PixelGameEngine *pge) {
    //Draw Background
    pge->DrawPartialDecal(position,
	    sprite->Decal(), {0, 0}, {16, 16});
    pge->DrawPartialDecal(position + olc::vi2d{scale.x - 16, 0},
	    sprite->Decal(), {32, 0}, {16, 16});
    pge->DrawPartialDecal(position + olc::vi2d{0, scale.y - 16},
	    sprite->Decal(), {0, 32}, {16, 16});
    pge->DrawPartialDecal(position + scale - olc::vi2d{16, 16},
	    sprite->Decal(), {32, 32}, {16, 16});
    pge->DrawPartialDecal(position + olc::vi2d{16, 0},
	    sprite->Decal(), {16, 0}, {16, 16},
	    {(scale.x - 32) / 16.0f, 1});
    pge->DrawPartialDecal(position + olc::vi2d{16, scale.y - 16},
	    sprite->Decal(), {16, 32}, {16, 16},
	    {(scale.x - 32) / 16.0f, 1});
    pge->DrawPartialDecal(position + olc::vi2d{0, 16},
	    sprite->Decal(), {0, 16}, {16, 16},
	    {1, (scale.y - 32) / 16.0f});
    pge->DrawPartialDecal(position + olc::vi2d{scale.x - 16, 16},
	    sprite->Decal(), {32, 16}, {16, 16},
	    {1, (scale.y - 32) / 16.0f});
    pge->DrawPartialDecal(position + olc::vi2d{16, 16},
	    sprite->Decal(), {16, 16}, {16, 16},
	    {(scale.x - 32) / 16.0f, (scale.y - 32) / 16.0f});

    pge->DrawStringDecal(position + olc::vi2d{6, 6},
	    curText.substr(0, int(curText.size() * (timeElapsed / soundSample.getLength())))
	    );
}